

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

QStyleOptionHeaderV2 * qstyleoption_cast<QStyleOptionHeaderV2*>(QStyleOption *opt)

{
  QStyleOption *opt_local;
  QStyleOption *local_8;
  
  if (((opt == (QStyleOption *)0x0) || (opt->version < 2)) || (local_8 = opt, opt->type != 8)) {
    local_8 = (QStyleOption *)0x0;
  }
  return (QStyleOptionHeaderV2 *)local_8;
}

Assistant:

T qstyleoption_cast(QStyleOption *opt)
{
    typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type Opt;
    if (opt && opt->version >= Opt::Version && (opt->type == Opt::Type
        || int(Opt::Type) == QStyleOption::SO_Default
        || (int(Opt::Type) == QStyleOption::SO_Complex
            && opt->type > QStyleOption::SO_Complex)))
        return static_cast<T>(opt);
    return nullptr;
}